

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  int *piVar2;
  JBLOCKROW paJVar3;
  jpeg_error_mgr *pjVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var13;
  long lVar14;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar5 = *(int *)((long)&pjVar1[4].start_pass + 4);
    if (iVar5 == 0) {
      process_restart(cinfo);
      iVar5 = *(int *)((long)&pjVar1[4].start_pass + 4);
    }
    *(int *)((long)&pjVar1[4].start_pass + 4) = iVar5 + -1;
  }
  if (*(int *)&pjVar1[2].start_pass != -1) {
    piVar2 = cinfo->natural_order;
    paJVar3 = *MCU_data;
    iVar5 = cinfo->cur_comp_info[0]->ac_tbl_no;
    for (iVar12 = cinfo->Ss; iVar12 <= cinfo->Se; iVar12 = iVar12 + (int)lVar10 + 1) {
      p_Var13 = (&pjVar1[0xc].decode_mcu)[iVar5];
      lVar10 = (long)(iVar12 * 3 + -3);
      iVar6 = arith_decode(cinfo,(uchar *)(p_Var13 + lVar10));
      if (iVar6 != 0) {
        return 1;
      }
      p_Var13 = p_Var13 + lVar10 + 2;
      lVar10 = 0;
      while (iVar6 = arith_decode(cinfo,(uchar *)(p_Var13 + -1)), iVar6 == 0) {
        p_Var13 = p_Var13 + 3;
        lVar10 = lVar10 + 1;
        if (cinfo->Se <= iVar12 + -1 + (int)lVar10) goto LAB_00112ed9;
      }
      iVar6 = arith_decode(cinfo,(uchar *)&pjVar1[0x14].decode_mcu);
      iVar7 = arith_decode(cinfo,(uchar *)p_Var13);
      if (iVar7 == 0) {
        uVar11 = 0;
      }
      else {
        iVar7 = arith_decode(cinfo,(uchar *)p_Var13);
        uVar11 = 1;
        if (iVar7 != 0) {
          lVar14 = 0xbd;
          if ((int)(uint)cinfo->arith_ac_K[iVar5] < iVar12 + (int)lVar10) {
            lVar14 = 0xd9;
          }
          p_Var13 = (&pjVar1[0xc].decode_mcu)[iVar5] + lVar14;
          uVar11 = 2;
          while (iVar7 = arith_decode(cinfo,(uchar *)p_Var13), iVar7 != 0) {
            uVar11 = uVar11 * 2;
            if (uVar11 == 0x8000) {
LAB_00112ed9:
              pjVar4 = cinfo->err;
              pjVar4->msg_code = 0x75;
              (*pjVar4->emit_message)((j_common_ptr)cinfo,-1);
              *(undefined4 *)&pjVar1[2].start_pass = 0xffffffff;
              return 1;
            }
            p_Var13 = p_Var13 + 1;
          }
        }
      }
      uVar9 = uVar11;
      while (1 < uVar9) {
        uVar9 = (int)uVar9 >> 1;
        uVar8 = arith_decode(cinfo,(uchar *)(p_Var13 + 0xe));
        if (uVar8 != 0) {
          uVar8 = uVar9;
        }
        uVar11 = uVar11 | uVar8;
      }
      uVar9 = ~uVar11;
      if (iVar6 == 0) {
        uVar9 = uVar11 + 1;
      }
      (*paJVar3)[piVar2[iVar12 + lVar10]] = (JCOEF)(uVar9 << ((byte)cinfo->Al & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    Al = cinfo->Al;
    natural_order = cinfo->natural_order;

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;	/* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)		/* if it's a band of zeroes... */
      EOBRUN--;			/* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
	r = s >> 4;
	s &= 15;
	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	  /* Scale and output coefficient in natural (dezigzagged) order */
	  (*block)[natural_order[k]] = (JCOEF) (s << Al);
	} else {
	  if (r == 15) {	/* ZRL */
	    k += 15;		/* skip 15 zeroes in band */
	  } else {		/* EOBr, run length is 2^r + appended bits */
	    EOBRUN = 1 << r;
	    if (r) {		/* EOBr, r > 0 */
	      CHECK_BIT_BUFFER(br_state, r, return FALSE);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    EOBRUN--;		/* this band is processed at this moment */
	    break;		/* force end-of-band */
	  }
	}
      }

      BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;	/* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}